

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bit_cost_t __thiscall
lzham::lzcompressor::state::get_cost
          (state *this,CLZBase *lzbase,search_accelerator *dict,lzdecision *lzdec)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  search_accelerator *this_00;
  bit_cost_t bVar4;
  lzdecision *in_RCX;
  CLZBase *in_RSI;
  long in_RDI;
  uint num_extra_bits;
  uint main_sym;
  uint match_high_sym;
  uint match_low_sym;
  uint match_extra;
  uint match_slot;
  int match_hist_index;
  uint lit_pred_1;
  uint delta_lit;
  uint rep_lit1;
  uint rep_lit0;
  uint lit_pred;
  uint lit_pred1;
  uint lit;
  bit_cost_t cost;
  uint is_match_model_index;
  uint lit_pred0;
  uint uVar5;
  search_accelerator *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  bit_cost_t local_30;
  uint local_28;
  uint local_24;
  lzdecision *local_20;
  CLZBase *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_24 = get_pred_char((state *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  local_28 = (local_24 >> 2) + *(int *)(in_RDI + 4) * 0x40;
  this_00 = (search_accelerator *)(in_RDI + 0x1c + (ulong)local_28 * 2);
  bVar2 = lzdecision::is_match(local_20);
  local_30 = adaptive_bit_model::get_cost((adaptive_bit_model *)this_00,(uint)bVar2);
  bVar2 = lzdecision::is_match(local_20);
  if (bVar2) {
    if (local_20->m_dist < 0) {
      bVar4 = adaptive_bit_model::get_cost
                        ((adaptive_bit_model *)(in_RDI + 0x61c + (ulong)*(uint *)(in_RDI + 4) * 2),1
                        );
      local_30 = bVar4 + local_30;
      local_50 = -1 - local_20->m_dist;
      if (local_50 == 0) {
        bVar4 = adaptive_bit_model::get_cost
                          ((adaptive_bit_model *)(in_RDI + 0x634 + (ulong)*(uint *)(in_RDI + 4) * 2)
                           ,1);
        local_30 = bVar4 + local_30;
        if (local_20->m_len == 1) {
          bVar4 = adaptive_bit_model::get_cost
                            ((adaptive_bit_model *)
                             (in_RDI + 0x64c + (ulong)*(uint *)(in_RDI + 4) * 2),1);
          local_30 = bVar4 + local_30;
        }
        else {
          bVar4 = adaptive_bit_model::get_cost
                            ((adaptive_bit_model *)
                             (in_RDI + 0x64c + (ulong)*(uint *)(in_RDI + 4) * 2),0);
          local_30 = bVar4 + local_30;
          bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                            ((raw_quasi_adaptive_huffman_data_model *)this_00,
                             (uint)((ulong)in_RDI >> 0x20));
          local_30 = bVar4 + local_30;
        }
      }
      else {
        bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                          ((raw_quasi_adaptive_huffman_data_model *)this_00,
                           (uint)((ulong)in_RDI >> 0x20));
        local_30 = bVar4 + local_30;
        bVar4 = adaptive_bit_model::get_cost
                          ((adaptive_bit_model *)(in_RDI + 0x634 + (ulong)*(uint *)(in_RDI + 4) * 2)
                           ,0);
        local_30 = bVar4 + local_30;
        if (local_50 == 1) {
          bVar4 = adaptive_bit_model::get_cost
                            ((adaptive_bit_model *)
                             (in_RDI + 0x664 + (ulong)*(uint *)(in_RDI + 4) * 2),1);
          local_30 = bVar4 + local_30;
        }
        else {
          bVar4 = adaptive_bit_model::get_cost
                            ((adaptive_bit_model *)
                             (in_RDI + 0x664 + (ulong)*(uint *)(in_RDI + 4) * 2),0);
          local_30 = bVar4 + local_30;
          if (local_50 == 2) {
            bVar4 = adaptive_bit_model::get_cost
                              ((adaptive_bit_model *)
                               (in_RDI + 0x67c + (ulong)*(uint *)(in_RDI + 4) * 2),1);
            local_30 = bVar4 + local_30;
          }
          else {
            bVar4 = adaptive_bit_model::get_cost
                              ((adaptive_bit_model *)
                               (in_RDI + 0x67c + (ulong)*(uint *)(in_RDI + 4) * 2),0);
            local_30 = bVar4 + local_30;
          }
        }
      }
    }
    else {
      bVar4 = adaptive_bit_model::get_cost
                        ((adaptive_bit_model *)(in_RDI + 0x61c + (ulong)*(uint *)(in_RDI + 4) * 2),0
                        );
      uVar5 = (uint)((ulong)in_RDI >> 0x20);
      local_30 = bVar4 + local_30;
      CLZBase::compute_lzx_position_slot(local_10,local_20->m_dist,&local_54,&local_58);
      if (8 < local_20->m_len) {
        bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                          ((raw_quasi_adaptive_huffman_data_model *)this_00,uVar5);
        local_30 = bVar4 + local_30;
      }
      bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                        ((raw_quasi_adaptive_huffman_data_model *)this_00,uVar5);
      local_30 = bVar4 + local_30;
      bVar1 = (local_10->super_CLZDecompBase).m_lzx_position_extra_bits[local_54];
      uVar3 = (uint)bVar1;
      if (uVar3 < 3) {
        local_30 = (ulong)bVar1 * 0x1000000 + local_30;
      }
      else {
        if (4 < uVar3) {
          local_30 = (uVar3 - 4) * 0x1000000 + local_30;
        }
        bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                          ((raw_quasi_adaptive_huffman_data_model *)this_00,uVar5);
        local_30 = bVar4 + local_30;
      }
    }
  }
  else {
    local_34 = search_accelerator::operator[](this_00,(uint)((ulong)in_RDI >> 0x20));
    uVar5 = (uint)((ulong)in_RDI >> 0x20);
    if (*(uint *)(in_RDI + 4) < 7) {
      local_38 = get_pred_char((state *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),this_00,uVar5,(int)in_RDI);
      local_3c = local_24 >> 5 | (local_38 >> 5) << 3;
      bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                        ((raw_quasi_adaptive_huffman_data_model *)this_00,
                         (uint)((ulong)in_RDI >> 0x20));
      local_30 = bVar4 + local_30;
    }
    else {
      local_40 = search_accelerator::operator[](this_00,uVar5);
      uVar5 = (uint)((ulong)in_RDI >> 0x20);
      local_44 = search_accelerator::operator[](this_00,uVar5);
      local_48 = local_40 ^ local_34;
      local_4c = local_40 >> 5 | (local_44 >> 5) << 3;
      bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                        ((raw_quasi_adaptive_huffman_data_model *)this_00,uVar5);
      local_30 = bVar4 + local_30;
    }
  }
  return local_30;
}

Assistant:

bit_cost_t lzcompressor::state::get_cost(CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec) const
   {
      const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, m_cur_state);
      LZHAM_ASSERT(is_match_model_index < LZHAM_ARRAY_SIZE(m_is_match_model));
      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(lzdec.is_match());

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            const uint lit_pred1 = get_pred_char(dict, lzdec.m_pos, 2);

            uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
                            (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

            // literal
            cost += m_lit_table[lit_pred].get_cost(lit);
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            const uint rep_lit1 = dict[(lzdec.m_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

            uint delta_lit = rep_lit0 ^ lit;

            uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
                            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

            cost += m_delta_lit_table[lit_pred].get_cost(delta_lit);
         }
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            cost += m_is_rep_model[m_cur_state].get_cost(1);

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               cost += m_is_rep0_model[m_cur_state].get_cost(1);

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(1);
               }
               else
               {
                  // normal rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(0);

                  cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);
               }
            }
            else
            {
               cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);

               // rep1-rep3 match
               cost += m_is_rep0_model[m_cur_state].get_cost(0);

               if (match_hist_index == 1)
               {
                  // rep1
                  cost += m_is_rep1_model[m_cur_state].get_cost(1);
               }
               else
               {
                  cost += m_is_rep1_model[m_cur_state].get_cost(0);

                  if (match_hist_index == 2)
                  {
                     // rep2
                     cost += m_is_rep2_model[m_cur_state].get_cost(1);
                  }
                  else
                  {
                     LZHAM_ASSERT(match_hist_index == 3);
                     // rep3
                     cost += m_is_rep2_model[m_cur_state].get_cost(0);
                  }
               }
            }
         }
         else
         {
            cost += m_is_rep_model[m_cur_state].get_cost(0);

            LZHAM_ASSERT(lzdec.m_len >= cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;
               cost += m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - 9);
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
               cost += (num_extra_bits << cBitCostScaleShift);
            else
            {
               if (num_extra_bits > 4)
                  cost += ((num_extra_bits - 4) << cBitCostScaleShift);

               cost += m_dist_lsb_table.get_cost(match_extra & 15);
            }
         }
      }

      return cost;
   }